

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>
capnp::readMessage(AsyncInputStream *input,ReaderOptions options,ArrayPtr<capnp::word> scratchSpace)

{
  AsyncMessageReader *pAVar1;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *other;
  word *in_R9;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> local_88;
  size_t local_78;
  word *pwStack_70;
  undefined1 local_50 [8];
  Promise<bool> promise;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> reader;
  AsyncInputStream *input_local;
  ArrayPtr<capnp::word> scratchSpace_local;
  ReaderOptions options_local;
  
  scratchSpace_local.size_ = options._8_8_;
  scratchSpace_local.ptr = in_R9;
  kj::heap<capnp::(anonymous_namespace)::AsyncMessageReader,capnp::ReaderOptions&>
            ((kj *)&promise,(ReaderOptions *)&scratchSpace_local.size_);
  pAVar1 = kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::operator->
                     ((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)
                      &promise);
  pwStack_70 = scratchSpace_local.ptr;
  local_78 = scratchSpace.size_;
  anon_unknown_0::AsyncMessageReader::read
            ((AsyncMessageReader *)local_50,(int)pAVar1,(void *)options.traversalLimitInWords,
             scratchSpace.size_);
  other = kj::mv<kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,decltype(nullptr)>>
                    ((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)
                     &promise);
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::Own(&local_88,other);
  kj::Promise<bool>::
  then<capnp::readMessage(kj::AsyncInputStream&,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
            ((Promise<bool> *)input,(Type *)local_50);
  readMessage(kj::AsyncInputStream&,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::$_0::~__0
            ((__0 *)&local_88);
  kj::Promise<bool>::~Promise((Promise<bool> *)local_50);
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::~Own
            ((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)&promise);
  return (PromiseBase)(PromiseBase)input;
}

Assistant:

kj::Promise<kj::Own<MessageReader>> readMessage(
    kj::AsyncInputStream& input, ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  auto reader = kj::heap<AsyncMessageReader>(options);
  auto promise = reader->read(input, scratchSpace);
  return promise.then([reader = kj::mv(reader)](bool success) mutable -> kj::Own<MessageReader> {
    if (!success) {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "Premature EOF."));
    }
    return kj::mv(reader);
  });
}